

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.cc
# Opt level: O2

void kratos::auto_insert_clock_enable(Generator *top)

{
  undefined1 local_90 [8];
  InsertClockIRVisitor visitor;
  
  InsertClockIRVisitor::InsertClockIRVisitor((InsertClockIRVisitor *)local_90,top);
  IRVisitor::visit_root((IRVisitor *)local_90,&top->super_IRNode);
  InsertClockIRVisitor::~InsertClockIRVisitor((InsertClockIRVisitor *)local_90);
  return;
}

Assistant:

void auto_insert_clock_enable(Generator* top) {
    InsertClockIRVisitor visitor(top);
    visitor.visit_root(top);
}